

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToChar<signed_char>(char value,iu_ostream *os)

{
  byte bVar1;
  size_t sVar2;
  ostream *poVar3;
  char str [2];
  char local_4b [3];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (value != '\0') {
    if (value < ' ') {
      std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
      local_4b[0] = ((byte)value >> 4) + 0x30;
      if (0x9f < (byte)value) {
        local_4b[0] = ((byte)value >> 4) + 0x37;
      }
      bVar1 = value & 0xf;
      local_4b[1] = bVar1 + 0x30;
      if (9 < bVar1) {
        local_4b[1] = bVar1 + 0x37;
      }
      local_4b[2] = 0;
      local_48 = local_38;
      sVar2 = strlen(local_4b);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_4b,local_4b + sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
    }
    else {
      local_4b[1] = '\0';
      local_4b[0] = value;
      std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
      local_48 = local_38;
      sVar2 = strlen(local_4b);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,local_4b,local_4b + sVar2)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_48,local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}